

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

void update_map(int num_iter)

{
  double dVar1;
  float fVar2;
  float fVar3;
  GLfloat new_height;
  GLfloat pd;
  GLfloat dz;
  GLfloat dx;
  size_t ii;
  float local_18;
  float disp;
  float circle_size;
  float center_z;
  float center_x;
  int num_iter_local;
  
  center_z = (float)num_iter;
  if (num_iter < 1) {
    __assert_fail("num_iter > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/examples/heightmap.c"
                  ,0x133,"void update_map(int)");
  }
  for (; center_z != 0.0; center_z = (float)((int)center_z + -1)) {
    generate_heightmap__circle(&circle_size,&disp,&local_18,(float *)((long)&ii + 4));
    ii._4_4_ = ii._4_4_ / 2.0;
    for (_dz = 0; _dz < 0x1900; _dz = _dz + 1) {
      fVar2 = circle_size - map_vertices[0][_dz];
      fVar3 = disp - map_vertices[2][_dz];
      dVar1 = sqrt((double)(fVar2 * fVar2 + fVar3 * fVar3));
      fVar2 = ii._4_4_;
      fVar3 = ((float)dVar1 * 2.0) / local_18;
      if (ABS(fVar3) <= 1.0) {
        dVar1 = cos((double)(fVar3 * 3.14));
        map_vertices[1][_dz] = fVar2 + (float)(dVar1 * (double)ii._4_4_) + map_vertices[1][_dz];
      }
    }
  }
  return;
}

Assistant:

static void update_map(int num_iter)
{
    assert(num_iter > 0);
    while(num_iter)
    {
        /* center of the circle */
        float center_x;
        float center_z;
        float circle_size;
        float disp;
        size_t ii;
        generate_heightmap__circle(&center_x, &center_z, &circle_size, &disp);
        disp = disp / 2.0f;
        for (ii = 0u ; ii < MAP_NUM_TOTAL_VERTICES ; ++ii)
        {
            GLfloat dx = center_x - map_vertices[0][ii];
            GLfloat dz = center_z - map_vertices[2][ii];
            GLfloat pd = (2.0f * (float) sqrt((dx * dx) + (dz * dz))) / circle_size;
            if (fabs(pd) <= 1.0f)
            {
                /* tx,tz is within the circle */
                GLfloat new_height = disp + (float) (cos(pd*3.14f)*disp);
                map_vertices[1][ii] += new_height;
            }
        }
        --num_iter;
    }
}